

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

void __thiscall cppcms::filters::datetime::datetime(datetime *this,datetime *other)

{
  long in_RSI;
  streamable *in_RDI;
  streamable *psVar1;
  
  psVar1 = in_RDI;
  streamable::streamable(in_RDI,in_RDI);
  std::__cxx11::string::string((string *)(psVar1 + 1),(string *)(in_RSI + 0x20));
  booster::copy_ptr<cppcms::filters::datetime::_data>::copy_ptr
            ((copy_ptr<cppcms::filters::datetime::_data> *)(in_RDI + 2));
  return;
}

Assistant:

datetime::datetime(datetime const &other) : time_(other.time_),tz_(other.tz_) {}